

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O1

void __thiscall argsman_tests::util_CheckValue::test_method(util_CheckValue *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__end;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_698;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_680;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_668;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_650;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_638;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_618;
  allocator_type local_5f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f8;
  allocator_type local_5d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  UniValue local_578;
  UniValue local_520;
  UniValue local_4c8;
  UniValue local_470;
  UniValue local_418;
  UniValue local_3c0;
  UniValue local_368;
  UniValue local_310;
  UniValue local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  UniValue local_240;
  UniValue local_1e8;
  UniValue local_190;
  undefined4 local_138;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  char cStack_118;
  undefined4 local_117;
  undefined2 local_113;
  char local_111;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  vector<UniValue,_std::allocator<UniValue>_> vStack_f8;
  undefined1 local_e0 [152];
  bool local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_128 = 0;
  local_138 = 0;
  local_e0._8_8_ = local_e0 + 0x18;
  local_e0._0_4_ = VNULL;
  local_e0[0x18] = '\0';
  local_e0._25_7_ = uStack_11f;
  local_e0[0x20] = cStack_118;
  local_e0._33_4_ = local_117;
  local_e0._37_2_ = local_113;
  local_e0[0x27] = local_111;
  local_e0._16_8_ = 0;
  local_120 = 0;
  local_e0._40_8_ = (pointer)0x0;
  local_e0._48_8_ = (pointer)0x0;
  local_e0._56_8_ = (pointer)0x0;
  local_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._64_8_ = (pointer)0x0;
  local_e0._72_8_ = (pointer)0x0;
  local_e0._80_8_ = (pointer)0x0;
  vStack_f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0._96_8_ = (char *)0x0;
  local_e0[0x70] = false;
  local_e0[0x79] = 0;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0[0x58] = true;
  local_e0[0x59] = true;
  local_e0[0x5a] = true;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130 = &local_120;
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_598);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,(char *)0x0,(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_598);
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
  local_260._M_dataplus._M_p = local_260._M_dataplus._M_p & 0xffffffffffffff00;
  ::UniValue::UniValue<bool,_bool,_true>(&local_190,(bool *)&local_260);
  local_e0._0_4_ = local_190.typ;
  paVar1 = &local_190.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_190.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_190.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_190.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_190.val.field_2._8_8_ >> 0x38);
    local_e0._8_8_ = local_e0 + 0x18;
  }
  else {
    local_e0._8_8_ = local_190.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_190.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_190.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_190.val._M_string_length;
  local_190.val._M_string_length = 0;
  local_190.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_190.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_190.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_190.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_190.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._64_8_ =
       local_190.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e0._72_8_ =
       local_190.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e0._80_8_ =
       local_190.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_190.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "0";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190.val._M_dataplus._M_p = (pointer)paVar1;
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_5b8);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5b8);
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_190.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_190.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_190.val._M_dataplus._M_p,
                    CONCAT71(local_190.val.field_2._M_allocated_capacity._1_7_,
                             local_190.val.field_2._M_local_buf[0]) + 1);
  }
  local_260._M_dataplus._M_p = local_260._M_dataplus._M_p & 0xffffffffffffff00;
  ::UniValue::UniValue<bool,_bool,_true>(&local_1e8,(bool *)&local_260);
  local_e0._0_4_ = local_1e8.typ;
  paVar1 = &local_1e8.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_1e8.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_1e8.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_1e8.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_1e8.val.field_2._8_8_ >> 0x38);
    local_e0._8_8_ = local_e0 + 0x18;
  }
  else {
    local_e0._8_8_ = local_1e8.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_1e8.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_1e8.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_1e8.val._M_string_length;
  local_1e8.val._M_string_length = 0;
  local_1e8.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_1e8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_1e8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_1e8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1e8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._64_8_ =
       local_1e8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e0._72_8_ =
       local_1e8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e0._80_8_ =
       local_1e8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1e8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "0";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.val._M_dataplus._M_p = (pointer)paVar1;
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_5d8);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5d8);
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1e8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8.val._M_dataplus._M_p,
                    CONCAT71(local_1e8.val.field_2._M_allocated_capacity._1_7_,
                             local_1e8.val.field_2._M_local_buf[0]) + 1);
  }
  local_5d9 = (allocator_type)0x1;
  ::UniValue::UniValue<bool,_bool,_true>(&local_240,(bool *)&local_5d9);
  local_e0._0_4_ = local_240.typ;
  paVar1 = &local_240.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_240.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_240.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_240.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_240.val.field_2._8_8_ >> 0x38);
    local_e0._8_8_ = local_e0 + 0x18;
  }
  else {
    local_e0._8_8_ = local_240.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_240.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_240.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_240.val._M_string_length;
  local_240.val._M_string_length = 0;
  local_240.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_240.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_240.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_240.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_240.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._80_8_ =
       local_240.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_240.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "1";
  local_e0._104_8_ = 1;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_240.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"1","");
  __l._M_len = 1;
  __l._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_5f8,__l,&local_5f9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_5f8);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=0",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_240.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_240.val._M_dataplus._M_p,
                    CONCAT71(local_240.val.field_2._M_allocated_capacity._1_7_,
                             local_240.val.field_2._M_local_buf[0]) + 1);
  }
  local_260._M_dataplus._M_p = local_260._M_dataplus._M_p & 0xffffffffffffff00;
  ::UniValue::UniValue<bool,_bool,_true>(&local_2b8,(bool *)&local_260);
  local_e0._0_4_ = local_2b8.typ;
  paVar1 = &local_2b8.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_2b8.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_2b8.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_2b8.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_2b8.val.field_2._8_8_ >> 0x38);
    local_e0._8_8_ = local_e0 + 0x18;
  }
  else {
    local_e0._8_8_ = local_2b8.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_2b8.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_2b8.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_2b8.val._M_string_length;
  local_2b8.val._M_string_length = 0;
  local_2b8.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_2b8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_2b8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_2b8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._64_8_ =
       local_2b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e0._72_8_ =
       local_2b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e0._80_8_ =
       local_2b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_2b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "0";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  local_618.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_618.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.val._M_dataplus._M_p = (pointer)paVar1;
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_618);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=1",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_618);
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2b8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8.val._M_dataplus._M_p,
                    CONCAT71(local_2b8.val.field_2._M_allocated_capacity._1_7_,
                             local_2b8.val.field_2._M_local_buf[0]) + 1);
  }
  local_260._M_dataplus._M_p = local_260._M_dataplus._M_p & 0xffffffffffffff00;
  ::UniValue::UniValue<bool,_bool,_true>(&local_310,(bool *)&local_260);
  local_e0._0_4_ = local_310.typ;
  local_e0._8_8_ = local_e0 + 0x18;
  paVar1 = &local_310.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_310.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_310.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_310.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_310.val.field_2._8_8_ >> 0x38);
  }
  else {
    local_e0._8_8_ = local_310.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_310.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_310.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_310.val._M_string_length;
  local_310.val._M_string_length = 0;
  local_310.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_310.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_310.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_310.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_310.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._64_8_ =
       local_310.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e0._72_8_ =
       local_310.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e0._80_8_ =
       local_310.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_310.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "0";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.val._M_dataplus._M_p = (pointer)paVar1;
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_638);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=2",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_638);
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_310.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_310.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_310.val._M_dataplus._M_p,
                    CONCAT71(local_310.val.field_2._M_allocated_capacity._1_7_,
                             local_310.val.field_2._M_local_buf[0]) + 1);
  }
  local_5d9 = (allocator_type)0x1;
  ::UniValue::UniValue<bool,_bool,_true>(&local_368,(bool *)&local_5d9);
  local_e0._0_4_ = local_368.typ;
  local_e0._8_8_ = local_e0 + 0x18;
  paVar1 = &local_368.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_368.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_368.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_368.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_368.val.field_2._8_8_ >> 0x38);
  }
  else {
    local_e0._8_8_ = local_368.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_368.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_368.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_368.val._M_string_length;
  local_368.val._M_string_length = 0;
  local_368.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_368.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_368.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_368.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_368.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._80_8_ =
       local_368.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_368.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "1";
  local_e0._104_8_ = 1;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  local_368.val._M_dataplus._M_p = (pointer)paVar1;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"1","");
  __l_00._M_len = 1;
  __l_00._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_650,__l_00,&local_5f9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_650);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=abc",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_650);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_368.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_368.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_368.val._M_dataplus._M_p,
                    CONCAT71(local_368.val.field_2._M_allocated_capacity._1_7_,
                             local_368.val.field_2._M_local_buf[0]) + 1);
  }
  ::UniValue::UniValue<const_char_(&)[1],_char[1],_true>(&local_3c0,(char (*) [1])0xf6cf21);
  local_e0._0_4_ = local_3c0.typ;
  paVar1 = &local_3c0.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_3c0.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_3c0.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_3c0.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_3c0.val.field_2._8_8_ >> 0x38);
    local_e0._8_8_ = local_e0 + 0x18;
  }
  else {
    local_e0._8_8_ = local_3c0.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_3c0.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_3c0.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_3c0.val._M_string_length;
  local_3c0.val._M_string_length = 0;
  local_3c0.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_3c0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_3c0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_3c0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3c0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._80_8_ =
       local_3c0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_3c0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  local_3c0.val._M_dataplus._M_p = (pointer)paVar1;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"","");
  __l_01._M_len = 1;
  __l_01._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_668,__l_01,&local_5d9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_668);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_668);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3c0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.val._M_dataplus._M_p,
                    CONCAT71(local_3c0.val.field_2._M_allocated_capacity._1_7_,
                             local_3c0.val.field_2._M_local_buf[0]) + 1);
  }
  ::UniValue::UniValue<const_char_(&)[1],_char[1],_true>(&local_418,(char (*) [1])0xf6cf21);
  local_e0._0_4_ = local_418.typ;
  paVar1 = &local_418.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_418.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_418.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_418.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_418.val.field_2._8_8_ >> 0x38);
    local_e0._8_8_ = local_e0 + 0x18;
  }
  else {
    local_e0._8_8_ = local_418.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_418.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_418.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_418.val._M_string_length;
  local_418.val._M_string_length = 0;
  local_418.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_418.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_418.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_418.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_418.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._80_8_ =
       local_418.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_418.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  local_418.val._M_dataplus._M_p = (pointer)paVar1;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"","");
  __l_02._M_len = 1;
  __l_02._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_680,__l_02,&local_5d9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_680);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_680);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_418.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_418.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_418.val._M_dataplus._M_p,
                    CONCAT71(local_418.val.field_2._M_allocated_capacity._1_7_,
                             local_418.val.field_2._M_local_buf[0]) + 1);
  }
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_470,(char (*) [2])0xfbe1bd);
  local_e0._0_4_ = local_470.typ;
  paVar1 = &local_470.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_470.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_470.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_470.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_470.val.field_2._8_8_ >> 0x38);
    local_e0._8_8_ = local_e0 + 0x18;
  }
  else {
    local_e0._8_8_ = local_470.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_470.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_470.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_470.val._M_string_length;
  local_470.val._M_string_length = 0;
  local_470.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_470.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_470.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_470.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_470.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_470.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_470.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._80_8_ =
       local_470.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_470.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_470.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_470.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "0";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  local_470.val._M_dataplus._M_p = (pointer)paVar1;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"0","");
  __l_03._M_len = 1;
  __l_03._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_698,__l_03,&local_5d9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_698);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=0",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_698);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_470.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_470.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_470.val._M_dataplus._M_p,
                    CONCAT71(local_470.val.field_2._M_allocated_capacity._1_7_,
                             local_470.val.field_2._M_local_buf[0]) + 1);
  }
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_4c8,(char (*) [2])0xf6d961);
  local_e0._0_4_ = local_4c8.typ;
  paVar1 = &local_4c8.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_4c8.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_4c8.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_4c8.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_4c8.val.field_2._8_8_ >> 0x38);
    local_e0._8_8_ = local_e0 + 0x18;
  }
  else {
    local_e0._8_8_ = local_4c8.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_4c8.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_4c8.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_4c8.val._M_string_length;
  local_4c8.val._M_string_length = 0;
  local_4c8.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_4c8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_4c8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_4c8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._80_8_ =
       local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "1";
  local_e0._104_8_ = 1;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  local_4c8.val._M_dataplus._M_p = (pointer)paVar1;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"1","");
  __l_04._M_len = 1;
  __l_04._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_6b0,__l_04,&local_5d9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_6b0);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=1",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4c8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8.val._M_dataplus._M_p,
                    CONCAT71(local_4c8.val.field_2._M_allocated_capacity._1_7_,
                             local_4c8.val.field_2._M_local_buf[0]) + 1);
  }
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_520,(char (*) [2])0xe68ecc);
  local_e0._0_4_ = local_520.typ;
  paVar1 = &local_520.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_520.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_520.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_520.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_520.val.field_2._8_8_ >> 0x38);
    local_e0._8_8_ = local_e0 + 0x18;
  }
  else {
    local_e0._8_8_ = local_520.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_520.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_520.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_520.val._M_string_length;
  local_520.val._M_string_length = 0;
  local_520.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_520.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_520.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_520.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_520.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_520.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_520.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._80_8_ =
       local_520.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_520.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_520.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_520.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "2";
  local_e0._104_8_ = 2;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  local_520.val._M_dataplus._M_p = (pointer)paVar1;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"2","");
  __l_05._M_len = 1;
  __l_05._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_6c8,__l_05,&local_5d9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_6c8);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=2",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_520.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_520.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_520.val._M_dataplus._M_p,
                    CONCAT71(local_520.val.field_2._M_allocated_capacity._1_7_,
                             local_520.val.field_2._M_local_buf[0]) + 1);
  }
  ::UniValue::UniValue<const_char_(&)[4],_char[4],_true>(&local_578,(char (*) [4])0xf71140);
  local_e0._0_4_ = local_578.typ;
  paVar1 = &local_578.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.val._M_dataplus._M_p == paVar1) {
    local_e0[0x20] = (undefined1)local_578.val.field_2._8_8_;
    local_e0._33_4_ = (undefined4)((ulong)local_578.val.field_2._8_8_ >> 8);
    local_e0._37_2_ = (undefined2)((ulong)local_578.val.field_2._8_8_ >> 0x28);
    local_e0[0x27] = (undefined1)((ulong)local_578.val.field_2._8_8_ >> 0x38);
    local_e0._8_8_ = local_e0 + 0x18;
  }
  else {
    local_e0._8_8_ = local_578.val._M_dataplus._M_p;
  }
  local_e0._25_7_ = local_578.val.field_2._M_allocated_capacity._1_7_;
  local_e0[0x18] = local_578.val.field_2._M_local_buf[0];
  local_e0._16_8_ = local_578.val._M_string_length;
  local_578.val._M_string_length = 0;
  local_578.val.field_2._M_local_buf[0] = '\0';
  local_e0._40_8_ =
       local_578.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._48_8_ =
       local_578.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._56_8_ =
       local_578.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_578.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_578.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._80_8_ =
       local_578.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_578.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_578.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0[0x58] = false;
  local_e0[0x59] = false;
  local_e0[0x5a] = false;
  local_48 = false;
  local_40 = (char *)0x0;
  local_e0._96_8_ = "abc";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  local_578.val._M_dataplus._M_p = (pointer)paVar1;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"abc","");
  __l_06._M_len = 1;
  __l_06._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_6e0,__l_06,&local_5d9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_6e0);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=abc",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == true) {
    local_48 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e0 + 0x80));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_e0 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e0 + 0x28));
  if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
    operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_578.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_578.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_578.val._M_dataplus._M_p,
                    CONCAT71(local_578.val.field_2._M_allocated_capacity._1_7_,
                             local_578.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_CheckValue, CheckValueTest)
{
    using M = ArgsManager;

    CheckValue(M::ALLOW_ANY, nullptr, Expect{{}}.DefaultString().DefaultInt().DefaultBool().List({}));
    CheckValue(M::ALLOW_ANY, "-novalue", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=0", Expect{true}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-novalue=1", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=2", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=abc", Expect{true}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-value", Expect{""}.String("").Int(0).Bool(true).List({""}));
    CheckValue(M::ALLOW_ANY, "-value=", Expect{""}.String("").Int(0).Bool(true).List({""}));
    CheckValue(M::ALLOW_ANY, "-value=0", Expect{"0"}.String("0").Int(0).Bool(false).List({"0"}));
    CheckValue(M::ALLOW_ANY, "-value=1", Expect{"1"}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-value=2", Expect{"2"}.String("2").Int(2).Bool(true).List({"2"}));
    CheckValue(M::ALLOW_ANY, "-value=abc", Expect{"abc"}.String("abc").Int(0).Bool(false).List({"abc"}));
}